

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QCss::ImportRule>::moveAppend
          (QGenericArrayOps<QCss::ImportRule> *this,ImportRule *b,ImportRule *e)

{
  qsizetype *pqVar1;
  ImportRule *pIVar2;
  
  if (b != e) {
    pIVar2 = (this->super_QArrayDataPointer<QCss::ImportRule>).ptr;
    for (; b < e; b = b + 1) {
      QCss::ImportRule::ImportRule
                (pIVar2 + (this->super_QArrayDataPointer<QCss::ImportRule>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QCss::ImportRule>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }